

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O1

void agg::qsort_cells<agg::cell_aa>(cell_aa **start,uint num)

{
  bool bVar1;
  cell_aa **ppcVar2;
  cell_aa **ppcVar3;
  undefined8 *puVar4;
  ulong uVar5;
  cell_aa **ppcVar6;
  cell_aa **ppcVar7;
  cell_aa *temp_1;
  cell_aa *pcVar8;
  cell_aa *temp;
  long lVar9;
  cell_aa *pcVar10;
  cell_aa **ppcVar11;
  cell_aa *temp_3;
  long lVar12;
  undefined8 local_2a8 [81];
  
  ppcVar3 = start + num;
  puVar4 = local_2a8;
  do {
    ppcVar2 = start;
    if ((int)((ulong)((long)ppcVar3 - (long)start) >> 3) < 10) {
LAB_00111414:
      ppcVar7 = ppcVar2 + 1;
      if (ppcVar7 < ppcVar3) {
        pcVar8 = *ppcVar2;
        pcVar10 = ppcVar2[1];
        ppcVar6 = ppcVar7;
        while (ppcVar2 = ppcVar7, pcVar10->x < pcVar8->x) {
          *ppcVar6 = pcVar8;
          ppcVar6[-1] = pcVar10;
          ppcVar11 = ppcVar6 + -1;
          if (ppcVar11 == start) break;
          pcVar8 = ppcVar6[-2];
          ppcVar6 = ppcVar11;
          pcVar10 = *ppcVar11;
        }
        goto LAB_00111414;
      }
      if (local_2a8 < puVar4) {
        start = (cell_aa **)puVar4[-2];
        ppcVar2 = (cell_aa **)puVar4[-1];
        puVar4 = puVar4 + -2;
        goto LAB_0011148d;
      }
      bVar1 = false;
    }
    else {
      uVar5 = (ulong)((long)ppcVar3 - (long)start) >> 1 & 0x3fffffff8;
      pcVar8 = *start;
      *start = *(cell_aa **)((long)start + uVar5);
      *(cell_aa **)((long)start + uVar5) = pcVar8;
      ppcVar7 = start + 1;
      ppcVar6 = ppcVar3 + -1;
      pcVar8 = start[1];
      if (ppcVar3[-1]->x < pcVar8->x) {
        *ppcVar7 = ppcVar3[-1];
        *ppcVar6 = pcVar8;
      }
      pcVar8 = *start;
      if (pcVar8->x < start[1]->x) {
        *start = start[1];
        start[1] = pcVar8;
      }
      pcVar8 = *start;
      if ((*ppcVar6)->x < pcVar8->x) {
        *start = *ppcVar6;
        *ppcVar6 = pcVar8;
      }
      while( true ) {
        lVar9 = (long)ppcVar3 - (long)ppcVar7;
        do {
          pcVar8 = ppcVar7[1];
          ppcVar7 = ppcVar7 + 1;
          lVar9 = lVar9 + -8;
        } while (pcVar8->x < (*start)->x);
        lVar12 = (long)ppcVar6 - (long)start;
        do {
          ppcVar2 = ppcVar6 + -1;
          ppcVar6 = ppcVar6 + -1;
          lVar12 = lVar12 + -8;
        } while ((*start)->x < (*ppcVar2)->x);
        if (ppcVar6 < ppcVar7) break;
        *ppcVar7 = *ppcVar2;
        *ppcVar6 = pcVar8;
      }
      pcVar8 = *start;
      *start = *ppcVar6;
      ppcVar11 = ppcVar7;
      if (lVar9 < lVar12) {
        ppcVar11 = start;
      }
      *ppcVar6 = pcVar8;
      ppcVar2 = ppcVar3;
      if (lVar12 <= lVar9) {
        ppcVar2 = ppcVar6;
        ppcVar6 = ppcVar3;
        ppcVar7 = start;
      }
      start = ppcVar7;
      *puVar4 = ppcVar11;
      puVar4[1] = ppcVar6;
      puVar4 = puVar4 + 2;
LAB_0011148d:
      bVar1 = true;
      ppcVar3 = ppcVar2;
    }
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void qsort_cells(Cell** start, unsigned num)
    {
        Cell**  stack[80];
        Cell*** top; 
        Cell**  limit;
        Cell**  base;

        limit = start + num;
        base  = start;
        top   = stack;

        for (;;)
        {
            int len = int(limit - base);

            Cell** i;
            Cell** j;
            Cell** pivot;

            if(len > qsort_threshold)
            {
                // we use base + len/2 as the pivot
                pivot = base + len / 2;
                swap_cells(base, pivot);

                i = base + 1;
                j = limit - 1;

                // now ensure that *i <= *base <= *j 
                if((*j)->x < (*i)->x)
                {
                    swap_cells(i, j);
                }

                if((*base)->x < (*i)->x)
                {
                    swap_cells(base, i);
                }

                if((*j)->x < (*base)->x)
                {
                    swap_cells(base, j);
                }

                for(;;)
                {
                    int x = (*base)->x;
                    do i++; while( (*i)->x < x );
                    do j--; while( x < (*j)->x );

                    if(i > j)
                    {
                        break;
                    }

                    swap_cells(i, j);
                }

                swap_cells(base, j);

                // now, push the largest sub-array
                if(j - base > limit - i)
                {
                    top[0] = base;
                    top[1] = j;
                    base   = i;
                }
                else
                {
                    top[0] = i;
                    top[1] = limit;
                    limit  = j;
                }
                top += 2;
            }
            else
            {
                // the sub-array is small, perform insertion sort
                j = base;
                i = j + 1;

                for(; i < limit; j = i, i++)
                {
                    for(; j[1]->x < (*j)->x; j--)
                    {
                        swap_cells(j + 1, j);
                        if (j == base)
                        {
                            break;
                        }
                    }
                }

                if(top > stack)
                {
                    top  -= 2;
                    base  = top[0];
                    limit = top[1];
                }
                else
                {
                    break;
                }
            }
        }
    }